

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldNameDedupJsonEqFull_Test::
DescriptorTest_FieldNameDedupJsonEqFull_Test(DescriptorTest_FieldNameDedupJsonEqFull_Test *this)

{
  DescriptorTest_FieldNameDedupJsonEqFull_Test *this_local;
  
  DescriptorTest::DescriptorTest(&this->super_DescriptorTest);
  (this->super_DescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DescriptorTest_FieldNameDedupJsonEqFull_Test_029a5830;
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldNameDedupJsonEqFull) {
  // Test a regression where json_name == full_name
  FileDescriptorProto proto;
  proto.set_name("file");
  auto* message = AddMessage(&proto, "Name1");
  auto* field =
      AddField(message, "Name2", 1, FieldDescriptorProto::LABEL_OPTIONAL,
               FieldDescriptorProto::TYPE_INT32);
  field->set_json_name("Name1.Name2");
  auto* file = pool_.BuildFile(proto);
  EXPECT_EQ(file->message_type(0)->name(), "Name1");
  EXPECT_EQ(file->message_type(0)->field(0)->name(), "Name2");
  EXPECT_EQ(file->message_type(0)->field(0)->full_name(), "Name1.Name2");
  EXPECT_EQ(file->message_type(0)->field(0)->json_name(), "Name1.Name2");
}